

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int JS_ToInt32SatFree(JSContext *ctx,int *pres,JSValue val)

{
  JSValueUnion JVar1;
  JSToNumberHintEnum flag;
  int iVar2;
  int iVar3;
  int iVar4;
  double d;
  
  iVar2 = -1;
  while( true ) {
    JVar1 = val.u;
    flag = (JSToNumberHintEnum)val.tag;
    if (flag < 4) {
      iVar2 = 0;
      iVar4 = val.u._0_4_;
      goto LAB_001222bf;
    }
    iVar4 = 0;
    if (flag == 6) goto LAB_001222bf;
    if (flag == 7) break;
    val = JS_ToNumberHintFree(ctx,val,flag);
    iVar4 = 0;
    if ((int)val.tag == 6) {
LAB_001222bf:
      *pres = iVar4;
      return iVar2;
    }
  }
  iVar3 = 0;
  iVar2 = 0;
  if (NAN(JVar1.float64)) {
    iVar4 = 0;
  }
  else {
    iVar4 = -0x80000000;
    iVar2 = iVar3;
    if ((-2147483648.0 <= JVar1.float64) && (iVar4 = 0x7fffffff, JVar1.float64 <= 2147483647.0)) {
      iVar4 = (int)JVar1.float64;
    }
  }
  goto LAB_001222bf;
}

Assistant:

static int JS_ToInt32SatFree(JSContext *ctx, int *pres, JSValue val)
{
    uint32_t tag;
    int ret;

 redo:
    tag = JS_VALUE_GET_NORM_TAG(val);
    switch(tag) {
    case JS_TAG_INT:
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    case JS_TAG_UNDEFINED:
        ret = JS_VALUE_GET_INT(val);
        break;
    case JS_TAG_EXCEPTION:
        *pres = 0;
        return -1;
    case JS_TAG_FLOAT64:
        {
            double d = JS_VALUE_GET_FLOAT64(val);
            if (isnan(d)) {
                ret = 0;
            } else {
                if (d < INT32_MIN)
                    ret = INT32_MIN;
                else if (d > INT32_MAX)
                    ret = INT32_MAX;
                else
                    ret = (int)d;
            }
        }
        break;
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
        {
            JSBigFloat *p = JS_VALUE_GET_PTR(val);
            bf_get_int32(&ret, &p->num, 0);
            JS_FreeValue(ctx, val);
        }
        break;
#endif
    default:
        val = JS_ToNumberFree(ctx, val);
        if (JS_IsException(val)) {
            *pres = 0;
            return -1;
        }
        goto redo;
    }
    *pres = ret;
    return 0;
}